

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O1

int arkAccessHAdaptMem(void *arkode_mem,char *fname,ARKodeMem *ark_mem,ARKodeHAdaptMem *hadapt_mem)

{
  int line;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    arkode_mem = (ARKodeMem)0x0;
    line = 0xe94;
  }
  else {
    *ark_mem = (ARKodeMem)arkode_mem;
    if (*(ARKodeHAdaptMem *)((long)arkode_mem + 0x308) != (ARKodeHAdaptMem)0x0) {
      *hadapt_mem = *(ARKodeHAdaptMem *)((long)arkode_mem + 0x308);
      return 0;
    }
    fname = "arkAccessHAdaptMem";
    msgfmt = "Adaptivity memory structure not allocated.";
    line = 0xe9b;
  }
  arkProcessError((ARKodeMem)arkode_mem,-0x15,line,fname,
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                  ,msgfmt);
  return -0x15;
}

Assistant:

int arkAccessHAdaptMem(void* arkode_mem, const char* fname, ARKodeMem* ark_mem,
                       ARKodeHAdaptMem* hadapt_mem)
{
  /* access ARKodeMem structure */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, fname, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  *ark_mem = (ARKodeMem)arkode_mem;
  if ((*ark_mem)->hadapt_mem == NULL)
  {
    arkProcessError(*ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARKADAPT_NO_MEM);
    return (ARK_MEM_NULL);
  }
  *hadapt_mem = (ARKodeHAdaptMem)(*ark_mem)->hadapt_mem;
  return (ARK_SUCCESS);
}